

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch_param.c
# Opt level: O2

int condEvent(void *ptr,mpt_event *ev)

{
  mpt_message *pmVar1;
  int iVar2;
  int iVar3;
  mpt_metatype *pmVar4;
  char *pcVar5;
  mpt_reply_context *rc;
  mpt_config *cfg;
  mpt_message tmp;
  
  if (ev == (mpt_event *)0x0) {
    if (ptr == (void *)0x0) {
      return 0;
    }
    (**(code **)(*ptr + 8))(ptr);
    return 0;
  }
  pmVar1 = ev->msg;
  if (pmVar1 == (mpt_message *)0x0) {
    rc = ev->reply;
    pcVar5 = "no default config assign";
  }
  else {
    tmp.used = pmVar1->used;
    tmp.base = pmVar1->base;
    tmp.cont = pmVar1->cont;
    tmp.clen = pmVar1->clen;
    iVar2 = getArg(&tmp,7,"mpt_dispatch_param.cond");
    if (iVar2 < 0) {
      return iVar2;
    }
    pmVar4 = (mpt_metatype *)ptr;
    if ((ptr != (void *)0x0) ||
       (pmVar4 = mpt_config_global((mpt_path *)0x0), pmVar4 != (mpt_metatype *)0x0)) {
      cfg = (mpt_config *)0x0;
      iVar3 = (*(pmVar4->_vptr->convertable).convert)((mpt_convertable *)pmVar4,0x85,&cfg);
      if (cfg == (mpt_config *)0x0 || iVar3 < 0) {
        iVar2 = -4;
      }
      else {
        iVar2 = mpt_message_assign(&tmp,iVar2,condConfig,cfg);
      }
      if (ptr == (void *)0x0) {
        (*pmVar4->_vptr->unref)(pmVar4);
      }
      if (-1 < iVar2) {
        if (iVar2 == 0) {
          pcVar5 = "keep config element";
        }
        else {
          pcVar5 = "assigned config element";
        }
        mpt_context_reply(ev->reply,0,"%s",pcVar5);
        return 0;
      }
      rc = ev->reply;
      pcVar5 = "failed to set global config";
      goto LAB_001130af;
    }
    rc = ev->reply;
    pcVar5 = "no global config";
  }
  iVar2 = -2;
LAB_001130af:
  mpt_context_reply(rc,iVar2,"%s",pcVar5);
  ev->id = 0;
  return 3;
}

Assistant:

static int condEvent(void *ptr, MPT_STRUCT(event) *ev)
{
	static const char _func[] = "mpt_dispatch_param.cond";
	MPT_INTERFACE(metatype) *conf = ptr;
	MPT_INTERFACE(config) *cfg;
	MPT_STRUCT(message) tmp;
	int ret;
	
	if (!ev) {
		if (conf) {
			conf->_vptr->unref(conf);
		}
		return 0;
	}
	if (!ev->msg) {
		return MPT_event_fail(ev, MPT_ERROR(BadValue), MPT_tr("no default config assign"));
	}
	tmp = *ev->msg;
	if ((ret = getArg(&tmp, MPT_MESGTYPE(ParamCond), _func)) < 0) {
		return ret;
	}
	/* fallback to global config */
	if (!conf
	    && !(conf = mpt_config_global(0))) {
		return MPT_event_fail(ev, MPT_ERROR(BadValue), MPT_tr("no global config"));
	}
	/* require valid config for replace */
	cfg = 0;
	if (MPT_metatype_convert(conf, MPT_ENUM(TypeConfigPtr), &cfg) < 0
	    || !cfg) {
		ret = MPT_ERROR(BadOperation);
	} else {
		ret = mpt_message_assign(&tmp, ret, condConfig, cfg);
	}
	/* unref global config */
	if (!ptr) {
		conf->_vptr->unref(conf);
	}
	if (ret < 0) {
		return MPT_event_fail(ev, ret, MPT_tr("failed to set global config"));
	}
	if (!ret) {
		return MPT_event_good(ev, MPT_tr("keep config element"));
	}
	return MPT_event_good(ev, MPT_tr("assigned config element"));
}